

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int little2_checkPiTarget(ENCODING *UNUSED_enc,char *ptr,char *end,int *tokPtr)

{
  char cVar1;
  bool bVar2;
  int upper;
  int *tokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *UNUSED_enc_local;
  
  bVar2 = false;
  *tokPtr = 0xb;
  if ((long)end - (long)ptr == 6) {
    if (ptr[1] == '\0') {
      cVar1 = *ptr;
    }
    else {
      cVar1 = -1;
    }
    if (cVar1 == 'X') {
      bVar2 = true;
    }
    else if (cVar1 != 'x') {
      return 1;
    }
    if (ptr[3] == '\0') {
      cVar1 = ptr[2];
    }
    else {
      cVar1 = -1;
    }
    if (cVar1 == 'M') {
      bVar2 = true;
    }
    else if (cVar1 != 'm') {
      return 1;
    }
    if (ptr[5] == '\0') {
      cVar1 = ptr[4];
    }
    else {
      cVar1 = -1;
    }
    if (cVar1 == 'L') {
      bVar2 = true;
    }
    else if (cVar1 != 'l') {
      return 1;
    }
    if (bVar2) {
      UNUSED_enc_local._4_4_ = 0;
    }
    else {
      *tokPtr = 0xc;
      UNUSED_enc_local._4_4_ = 1;
    }
  }
  else {
    UNUSED_enc_local._4_4_ = 1;
  }
  return UNUSED_enc_local._4_4_;
}

Assistant:

static int PTRCALL
PREFIX(checkPiTarget)(const ENCODING *UNUSED_P(enc), const char *ptr,
                      const char *end, int *tokPtr)
{
  int upper = 0;
  *tokPtr = XML_TOK_PI;
  if (end - ptr != MINBPC(enc)*3)
    return 1;
  switch (BYTE_TO_ASCII(enc, ptr)) {
  case ASCII_x:
    break;
  case ASCII_X:
    upper = 1;
    break;
  default:
    return 1;
  }
  ptr += MINBPC(enc);
  switch (BYTE_TO_ASCII(enc, ptr)) {
  case ASCII_m:
    break;
  case ASCII_M:
    upper = 1;
    break;
  default:
    return 1;
  }
  ptr += MINBPC(enc);
  switch (BYTE_TO_ASCII(enc, ptr)) {
  case ASCII_l:
    break;
  case ASCII_L:
    upper = 1;
    break;
  default:
    return 1;
  }
  if (upper)
    return 0;
  *tokPtr = XML_TOK_XML_DECL;
  return 1;
}